

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

vector<slang::BufferID,_std::allocator<slang::BufferID>_> * __thiscall
slang::SourceManager::getAllBuffers
          (vector<slang::BufferID,_std::allocator<slang::BufferID>_> *__return_storage_ptr__,
          SourceManager *this)

{
  uint32_t value;
  ulong uVar1;
  size_type sVar2;
  basic_string_view<char,_std::char_traits<char>_> name;
  BufferID local_3c;
  ulong local_38;
  size_t i;
  undefined1 local_28 [8];
  shared_lock<std::shared_mutex> lock;
  SourceManager *this_local;
  vector<slang::BufferID,_std::allocator<slang::BufferID>_> *result;
  
  lock._8_8_ = this;
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)local_28,&this->mut);
  i._7_1_ = 0;
  std::vector<slang::BufferID,_std::allocator<slang::BufferID>_>::vector(__return_storage_ptr__);
  for (local_38 = 1; uVar1 = local_38,
      sVar2 = std::
              vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
              ::size(&this->bufferEntries), uVar1 < sVar2; local_38 = local_38 + 1) {
    value = (uint32_t)local_38;
    name = sv("",0);
    BufferID::BufferID(&local_3c,value,name);
    std::vector<slang::BufferID,_std::allocator<slang::BufferID>_>::push_back
              (__return_storage_ptr__,&local_3c);
  }
  i._7_1_ = 1;
  std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BufferID> SourceManager::getAllBuffers() const {
    std::shared_lock lock(mut);
    std::vector<BufferID> result;
    for (size_t i = 1; i < bufferEntries.size(); i++)
        result.push_back(BufferID((uint32_t)i, ""sv));

    return result;
}